

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::addLearnedClause(Solver *this,vec<Minisat::Lit> *cls)

{
  bool bVar1;
  int iVar2;
  CRef CVar3;
  Lit *pLVar4;
  Solver *in_RSI;
  uint *in_RDI;
  CRef cr;
  CRef in_stack_0000003c;
  CRef in_stack_00000040;
  int in_stack_00000044;
  Solver *in_stack_00000048;
  Lit in_stack_00000054;
  bool in_stack_0000006b;
  int in_stack_0000006c;
  Solver *in_stack_00000070;
  Ref r;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  lbool b;
  Lit in_stack_ffffffffffffffe0;
  lbool local_1a;
  lbool in_stack_ffffffffffffffe7;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if ((*(byte *)((long)in_RDI + 0x701) & 1) != 0) {
    *(long *)(in_RDI + 0x1c2) = *(long *)(in_RDI + 0x1c2) + 1;
    iVar2 = vec<Minisat::Lit>::size((vec<Minisat::Lit> *)in_RSI);
    if (iVar2 == 1) {
      vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)in_RSI,0);
      value((Solver *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
            in_stack_ffffffffffffffe0);
      lbool::lbool((lbool *)&stack0xffffffffffffffe7,'\x01');
      bVar1 = lbool::operator==((lbool *)&stack0xffffffffffffffef,in_stack_ffffffffffffffe7);
      if (bVar1) {
        *(undefined1 *)(in_RDI + 0x8a) = 0;
      }
      else {
        cancelUntil(in_stack_00000070,in_stack_0000006c,in_stack_0000006b);
        pLVar4 = vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)in_RSI,0);
        local_1a = value((Solver *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                         (Lit)pLVar4->x);
        b.value = (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18);
        lbool::lbool((lbool *)&stack0xffffffffffffffdf,'\x02');
        bVar1 = lbool::operator==(&local_1a,b);
        if (bVar1) {
          vec<Minisat::Lit>::operator[]((vec<Minisat::Lit> *)in_RSI,0);
          uncheckedEnqueue(in_stack_00000048,in_stack_00000054,in_stack_00000044,in_stack_00000040);
        }
      }
    }
    else {
      CVar3 = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                        ((ClauseAllocator *)in_RSI,
                         (vec<Minisat::Lit> *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                         (bool)in_stack_ffffffffffffffe7.value);
      vec<unsigned_int>::push((vec<unsigned_int> *)CONCAT44(CVar3,in_stack_ffffffffffffffd0),in_RDI)
      ;
      r = (Ref)((ulong)in_RDI >> 0x20);
      attachClause((Solver *)CONCAT44(in_stack_00000044,in_stack_00000040),in_stack_0000003c);
      ClauseAllocator::operator[]((ClauseAllocator *)CONCAT44(CVar3,in_stack_ffffffffffffffd0),r);
      claBumpActivity(in_RSI,(Clause *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
                     );
    }
  }
  return;
}

Assistant:

void Solver::addLearnedClause(const vec<Lit> &cls)
{
    /* allow to reject clause */
    if (!receiveClauses) return;

    assert(cls.size() > 0 && "should we really share empty clauses?");
    // TODO: implement filters here!

    receivedCls++;

    if (cls.size() == 1) {
        if (value(cls[0]) == l_False) {
            ok = false;
        } else {
            cancelUntil(0);
            if (value(cls[0]) == l_Undef) uncheckedEnqueue(cls[0], 0);
        }
    } else {
        /* currently, we cannot tell much about the quality of the clause */
        CRef cr = ca.alloc(cls, true);
        learnts_local.push(cr);
        assert((value(cls[0]) != l_False || value(cls[1]) != l_False) && "cannot watch falsified literals");
        attachClause(cr);
        claBumpActivity(ca[cr]);
    }
}